

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldMetadata
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  WireType WVar4;
  CppType CVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  size_type sVar8;
  size_type sVar9;
  reference ppEVar10;
  reference ppFVar11;
  OneofDescriptor *pOVar12;
  string *psVar13;
  reference pvVar14;
  char *pcVar15;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  string *__s;
  undefined8 *in_RDI;
  string serializer;
  int num_field_metadata;
  int type;
  FieldGenerator *generator_1;
  string ptr;
  string classfieldname;
  uint32 tag_1;
  FieldDescriptor *field_1;
  ExtensionRange *range;
  int extension_idx;
  int i_2;
  int i_1;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  SaveState saver;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  uint32 tag;
  FieldGenerator *generator;
  FieldDescriptor *field;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  sorted;
  Formatter format;
  Options *in_stack_fffffffffffff5c8;
  LogMessage *in_stack_fffffffffffff5d0;
  allocator *paVar16;
  undefined4 in_stack_fffffffffffff5d8;
  LogLevel in_stack_fffffffffffff5dc;
  LogMessage *in_stack_fffffffffffff5e0;
  string *in_stack_fffffffffffff5e8;
  allocator *in_stack_fffffffffffff5f8;
  Formatter *in_stack_fffffffffffff600;
  int in_stack_fffffffffffff608;
  undefined4 in_stack_fffffffffffff60c;
  Options *in_stack_fffffffffffff610;
  undefined4 in_stack_fffffffffffff618;
  int in_stack_fffffffffffff61c;
  OneofDescriptor *in_stack_fffffffffffff620;
  Descriptor *in_stack_fffffffffffff628;
  undefined7 in_stack_fffffffffffff638;
  undefined1 in_stack_fffffffffffff63f;
  FieldOptions *in_stack_fffffffffffff640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff688;
  uint32 in_stack_fffffffffffff68c;
  FieldGenerator *in_stack_fffffffffffff690;
  undefined4 in_stack_fffffffffffff698;
  int in_stack_fffffffffffff69c;
  Descriptor *in_stack_fffffffffffff6a0;
  Descriptor *in_stack_fffffffffffff6a8;
  Formatter *in_stack_fffffffffffff6b0;
  MessageOptions *in_stack_fffffffffffff6c0;
  Descriptor *in_stack_fffffffffffff6c8;
  Descriptor *in_stack_fffffffffffff6d0;
  undefined4 in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff6dc;
  Formatter *in_stack_fffffffffffff6e0;
  allocator local_759;
  string local_758 [32];
  int local_738;
  allocator local_731;
  string local_730 [32];
  long local_710;
  allocator local_701;
  string local_700 [39];
  undefined1 local_6d9 [33];
  string local_6b8 [32];
  string local_698 [36];
  uint32 local_674;
  FieldGenerator *local_670;
  string local_638 [39];
  undefined1 local_611 [33];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  int local_550;
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [32];
  string local_500 [36];
  uint32 local_4dc;
  FieldDescriptor *local_4d8;
  value_type local_4d0;
  int local_4c4;
  int local_4c0;
  ExtensionRange **local_4b8;
  ExtensionRange **local_4b0;
  ExtensionRange *local_4a8;
  int local_49c;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  local_498 [3];
  allocator local_441;
  string local_440 [80];
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [39];
  byte local_321;
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [80];
  string local_268 [39];
  allocator local_241;
  string local_240 [80];
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [80];
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [84];
  uint32 local_94;
  FieldGenerator *local_90;
  FieldDescriptor *local_88;
  int local_80;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_70;
  undefined4 local_54;
  int local_4;
  
  Formatter::Formatter
            ((Formatter *)in_stack_fffffffffffff5d0,(Printer *)in_stack_fffffffffffff5c8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x4f8e93);
  if ((*(byte *)((long)in_RDI + 0x59) & 1) == 0) {
    local_4 = 0;
    local_54 = 1;
  }
  else {
    anon_unknown_0::SortFieldsByNumber(in_stack_fffffffffffff628);
    bVar1 = IsMapEntryMessage((Descriptor *)0x4f8ee6);
    if (bVar1) {
      for (local_80 = 0; local_80 < 2; local_80 = local_80 + 1) {
        ppFVar11 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::operator[](&local_70,(long)local_80);
        local_88 = *ppFVar11;
        local_90 = FieldGeneratorMap::get
                             ((FieldGeneratorMap *)in_stack_fffffffffffff640,
                              (FieldDescriptor *)
                              CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638));
        iVar3 = FieldDescriptor::number(local_88);
        FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffff5e0);
        WVar4 = internal::WireFormat::WireTypeForFieldType(0);
        local_94 = internal::WireFormatLite::MakeTag(iVar3,WVar4);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x4f8fe6);
        QualifiedClassName_abi_cxx11_
                  ((Descriptor *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
                   in_stack_fffffffffffff610);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_108,"classtype",&local_109);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff610,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        std::__cxx11::string::operator=((string *)pmVar6,local_e8);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        std::__cxx11::string::~string(local_e8);
        FieldName_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff5f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,"field_name",&local_151);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff610,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        std::__cxx11::string::operator=((string *)pmVar6,local_130);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
        std::__cxx11::string::~string(local_130);
        strings::AlphaNum::AlphaNum
                  ((AlphaNum *)in_stack_fffffffffffff5d0,
                   (uint)((ulong)in_stack_fffffffffffff5c8 >> 0x20));
        StrCat_abi_cxx11_((AlphaNum *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608))
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c8,"tag",&local_1c9);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff610,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        std::__cxx11::string::operator=((string *)pmVar6,local_178);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
        std::__cxx11::string::~string(local_178);
        strings::AlphaNum::AlphaNum
                  ((AlphaNum *)in_stack_fffffffffffff5d0,
                   (int)((ulong)in_stack_fffffffffffff5c8 >> 0x20));
        StrCat_abi_cxx11_((AlphaNum *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608))
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_240,"hasbit",&local_241);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff610,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        std::__cxx11::string::operator=((string *)pmVar6,local_1f0);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
        std::__cxx11::string::~string(local_1f0);
        anon_unknown_0::CalcFieldNum
                  ((FieldGenerator *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                   (FieldDescriptor *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
        strings::AlphaNum::AlphaNum
                  ((AlphaNum *)in_stack_fffffffffffff5d0,
                   (uint)((ulong)in_stack_fffffffffffff5c8 >> 0x20));
        StrCat_abi_cxx11_((AlphaNum *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608))
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b8,"type",&local_2b9);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff610,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        std::__cxx11::string::operator=((string *)pmVar6,local_268);
        std::__cxx11::string::~string(local_2b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        std::__cxx11::string::~string(local_268);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2e0,"ptr",&local_2e1);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff610,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        std::__cxx11::string::operator=((string *)pmVar6,"nullptr");
        std::__cxx11::string::~string(local_2e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
        CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4f9449);
        if (CVar5 == CPPTYPE_MESSAGE) {
          local_321 = 0;
          FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffff5d0);
          bVar1 = IsMapEntryMessage((Descriptor *)0x4f948e);
          if (bVar1) {
            internal::LogMessage::LogMessage
                      (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5dc,
                       (char *)in_stack_fffffffffffff5d0,
                       (int)((ulong)in_stack_fffffffffffff5c8 >> 0x20));
            local_321 = 1;
            internal::LogMessage::operator<<
                      (in_stack_fffffffffffff5d0,(char *)in_stack_fffffffffffff5c8);
            internal::LogFinisher::operator=
                      ((LogFinisher *)in_stack_fffffffffffff5d0,
                       (LogMessage *)in_stack_fffffffffffff5c8);
          }
          if ((local_321 & 1) != 0) {
            internal::LogMessage::~LogMessage((LogMessage *)0x4f951e);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3c8,"TableStruct",&local_3c9);
          FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffff5d0);
          UniqueName(in_stack_fffffffffffff5e8,(Descriptor *)in_stack_fffffffffffff5e0,
                     (Options *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff5d0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                         (char *)in_stack_fffffffffffff5d0);
          FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffff5d0);
          anon_unknown_0::FindMessageIndexInFile((Descriptor *)in_stack_fffffffffffff620);
          strings::AlphaNum::AlphaNum
                    ((AlphaNum *)in_stack_fffffffffffff5d0,
                     (int)((ulong)in_stack_fffffffffffff5c8 >> 0x20));
          StrCat_abi_cxx11_((AlphaNum *)
                            CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff600);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_440,"ptr",&local_441);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff610,
                                (key_type *)
                                CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
          std::__cxx11::string::operator=((string *)pmVar6,local_348);
          std::__cxx11::string::~string(local_440);
          std::allocator<char>::~allocator((allocator<char> *)&local_441);
          std::__cxx11::string::~string(local_348);
          std::__cxx11::string::~string(local_3f0);
          std::__cxx11::string::~string(local_368);
          std::__cxx11::string::~string(local_388);
          std::__cxx11::string::~string(local_3a8);
          std::__cxx11::string::~string(local_3c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        }
        Formatter::SaveState::SaveState
                  ((SaveState *)in_stack_fffffffffffff5d0,(Formatter *)in_stack_fffffffffffff5c8);
        Formatter::AddMap(in_stack_fffffffffffff600,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff5f8);
        Formatter::operator()<>
                  ((Formatter *)in_stack_fffffffffffff610,
                   (char *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        Formatter::SaveState::~SaveState((SaveState *)in_stack_fffffffffffff5d0);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x4f9b2f);
      }
      local_4 = 2;
      local_54 = 1;
    }
    else {
      Formatter::operator()<>
                ((Formatter *)in_stack_fffffffffffff610,
                 (char *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
      std::
      vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                *)0x4f9bb6);
      Descriptor::extension_range_count((Descriptor *)*in_RDI);
      std::
      vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::reserve((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 *)in_stack_fffffffffffff600,(size_type)in_stack_fffffffffffff5f8);
      for (local_49c = 0; iVar3 = local_49c,
          iVar2 = Descriptor::extension_range_count((Descriptor *)*in_RDI), iVar3 < iVar2;
          local_49c = local_49c + 1) {
        local_4a8 = Descriptor::extension_range((Descriptor *)*in_RDI,local_49c);
        std::
        vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ::push_back((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     *)in_stack_fffffffffffff5d0,(value_type *)in_stack_fffffffffffff5c8);
      }
      local_4b0 = (ExtensionRange **)
                  std::
                  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                  ::begin((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                           *)in_stack_fffffffffffff5c8);
      local_4b8 = (ExtensionRange **)
                  std::
                  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                  ::end((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                         *)in_stack_fffffffffffff5c8);
      std::
      sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>
                (local_4b0,local_4b8);
      local_4c0 = 0;
      local_4c4 = 0;
      while( true ) {
        while( true ) {
          uVar7 = (ulong)local_4c4;
          sVar8 = std::
                  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                  ::size(local_498);
          bVar1 = false;
          if (uVar7 < sVar8) {
            sVar8 = (size_type)local_4c0;
            sVar9 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::size(&local_70);
            bVar1 = true;
            if (sVar8 != sVar9) {
              ppEVar10 = std::
                         vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                         ::operator[](local_498,(long)local_4c4);
              iVar3 = (*ppEVar10)->start;
              ppFVar11 = std::
                         vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ::operator[](&local_70,(long)local_4c0);
              iVar2 = FieldDescriptor::number(*ppFVar11);
              bVar1 = iVar3 < iVar2;
            }
          }
          if (!bVar1) break;
          ppEVar10 = std::
                     vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ::operator[](local_498,(long)local_4c4);
          local_4d0 = *ppEVar10;
          Formatter::operator()
                    (in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8,
                     (int *)in_stack_fffffffffffff6a0,
                     (int *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
          local_4c4 = local_4c4 + 1;
        }
        sVar8 = (size_type)local_4c0;
        sVar9 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(&local_70);
        if (sVar8 == sVar9) break;
        ppFVar11 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::operator[](&local_70,(long)local_4c0);
        local_4d8 = *ppFVar11;
        iVar3 = FieldDescriptor::number(local_4d8);
        FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffff5e0);
        WVar4 = internal::WireFormat::WireTypeForFieldType(0);
        local_4dc = internal::WireFormatLite::MakeTag(iVar3,WVar4);
        bVar1 = FieldDescriptor::is_packed
                          ((FieldDescriptor *)
                           CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
        if (bVar1) {
          iVar3 = FieldDescriptor::number(local_4d8);
          local_4dc = internal::WireFormatLite::MakeTag(iVar3,WIRETYPE_LENGTH_DELIMITED);
        }
        FieldName_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff5f8);
        pOVar12 = FieldDescriptor::containing_oneof(local_4d8);
        if (pOVar12 != (OneofDescriptor *)0x0) {
          pOVar12 = FieldDescriptor::containing_oneof(local_4d8);
          psVar13 = OneofDescriptor::name_abi_cxx11_(pOVar12);
          std::__cxx11::string::operator=(local_500,(string *)psVar13);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_520,"field_name",&local_521);
        Formatter::Set<std::__cxx11::string>
                  ((Formatter *)in_stack_fffffffffffff610,
                   (string *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff600);
        std::__cxx11::string::~string(local_520);
        std::allocator<char>::~allocator((allocator<char> *)&local_521);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_548,"nullptr",&local_549);
        std::allocator<char>::~allocator((allocator<char> *)&local_549);
        CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4fa0c2);
        if (CVar5 == CPPTYPE_MESSAGE) {
          FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffff5d0);
          bVar1 = IsMapEntryMessage((Descriptor *)0x4fa0ff);
          if (!bVar1) {
            in_stack_fffffffffffff6c8 =
                 FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffff5d0);
            in_stack_fffffffffffff6c0 = Descriptor::options(in_stack_fffffffffffff6c8);
            bVar1 = MessageOptions::message_set_wire_format((MessageOptions *)0x4fa2c1);
            if (!bVar1) {
              in_stack_fffffffffffff6b0 = (Formatter *)local_611;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_611 + 1),"TableStruct",
                         (allocator *)in_stack_fffffffffffff6b0);
              in_stack_fffffffffffff6a8 =
                   FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffff5d0);
              UniqueName(in_stack_fffffffffffff5e8,(Descriptor *)in_stack_fffffffffffff5e0,
                         (Options *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
              std::operator+((char *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff5d0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                             (char *)in_stack_fffffffffffff5d0);
              in_stack_fffffffffffff6a0 =
                   FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffff5d0);
              in_stack_fffffffffffff69c =
                   anon_unknown_0::FindMessageIndexInFile((Descriptor *)in_stack_fffffffffffff620);
              strings::AlphaNum::AlphaNum
                        ((AlphaNum *)in_stack_fffffffffffff5d0,
                         (int)((ulong)in_stack_fffffffffffff5c8 >> 0x20));
              StrCat_abi_cxx11_((AlphaNum *)
                                CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff600);
              std::__cxx11::string::operator=(local_548,local_590);
              std::__cxx11::string::~string(local_590);
              std::__cxx11::string::~string(local_638);
              std::__cxx11::string::~string(local_5b0);
              std::__cxx11::string::~string(local_5d0);
              std::__cxx11::string::~string(local_5f0);
              std::__cxx11::string::~string((string *)(local_611 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_611);
            }
            goto LAB_004fa559;
          }
          in_stack_fffffffffffff6e0 =
               (Formatter *)
               FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffff5d0);
          in_stack_fffffffffffff6dc =
               anon_unknown_0::FindMessageIndexInFile((Descriptor *)in_stack_fffffffffffff620);
          local_550 = in_stack_fffffffffffff6dc;
          in_stack_fffffffffffff6d0 =
               FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffff5d0);
          QualifiedClassName_abi_cxx11_
                    ((Descriptor *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
                     in_stack_fffffffffffff610);
          Formatter::operator()
                    (in_stack_fffffffffffff6e0,
                     (char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                     (uint *)in_stack_fffffffffffff6d0,(int *)in_stack_fffffffffffff6c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff6c0);
          std::__cxx11::string::~string(local_570);
          local_54 = 10;
        }
        else {
LAB_004fa559:
          in_stack_fffffffffffff690 =
               FieldGeneratorMap::get
                         ((FieldGeneratorMap *)in_stack_fffffffffffff640,
                          (FieldDescriptor *)
                          CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638));
          local_670 = in_stack_fffffffffffff690;
          in_stack_fffffffffffff68c =
               anon_unknown_0::CalcFieldNum
                         ((FieldGenerator *)
                          CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                          (FieldDescriptor *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
          pcVar15 = (char *)(in_RDI + 6);
          local_674 = in_stack_fffffffffffff68c;
          bVar1 = IsLazy((FieldDescriptor *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
          in_stack_fffffffffffff688 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff688);
          if (bVar1) {
            local_674 = 0x69;
            in_stack_fffffffffffff680 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_6d9 + 1),"proto_ns",(allocator *)in_stack_fffffffffffff680);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff610,
                         (key_type *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
            std::operator+((char *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
                           &in_stack_fffffffffffff610->dllexport_decl);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                           (char *)in_stack_fffffffffffff5d0);
            __s = local_698;
            std::__cxx11::string::operator=(local_548,local_698);
            std::__cxx11::string::~string(local_698);
            std::__cxx11::string::~string(local_6b8);
            std::__cxx11::string::~string((string *)(local_6d9 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_6d9);
            pOVar12 = FieldDescriptor::containing_oneof(local_4d8);
            if (pOVar12 == (OneofDescriptor *)0x0) {
              Descriptor::file((Descriptor *)*in_RDI);
              bVar1 = HasFieldPresence((FileDescriptor *)0x4fa7d0);
              if (bVar1) {
                pcVar15 = FieldDescriptor::index(local_4d8,(char *)__s,__c);
                pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x21),
                                     (long)(int)pcVar15);
                if (*pvVar14 != -1) goto LAB_004fa848;
              }
              std::__cxx11::string::operator+=(local_548,"NoPresence");
            }
            else {
              std::__cxx11::string::operator+=(local_548,"OneOf");
            }
LAB_004fa848:
            pcVar15 = ")";
            std::__cxx11::string::operator+=(local_548,")");
          }
          in_stack_fffffffffffff640 = FieldDescriptor::options(local_4d8);
          in_stack_fffffffffffff63f = FieldOptions::weak((FieldOptions *)0x4fa87e);
          if ((bool)in_stack_fffffffffffff63f) {
            Formatter::operator()
                      ((Formatter *)in_stack_fffffffffffff690,
                       (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                       (uint *)in_stack_fffffffffffff680);
          }
          else {
            pOVar12 = FieldDescriptor::containing_oneof(local_4d8);
            if (pOVar12 == (OneofDescriptor *)0x0) {
              in_stack_fffffffffffff610 = (Options *)Descriptor::file((Descriptor *)*in_RDI);
              bVar1 = HasFieldPresence((FileDescriptor *)0x4faa0d);
              in_stack_fffffffffffff60c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff60c);
              if (bVar1) {
                in_stack_fffffffffffff600 = (Formatter *)(in_RDI + 0x21);
                pcVar15 = FieldDescriptor::index(local_4d8,pcVar15,__c_01);
                in_stack_fffffffffffff608 = (int)pcVar15;
                pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff600,
                                     (long)in_stack_fffffffffffff608);
                if (*pvVar14 != -1) {
                  in_stack_fffffffffffff5f8 = &local_731;
                  std::allocator<char>::allocator();
                  pcVar15 = "hasbitsoffset";
                  std::__cxx11::string::string(local_730,"hasbitsoffset",in_stack_fffffffffffff5f8);
                  in_stack_fffffffffffff5e8 = (string *)(in_RDI + 0x21);
                  pcVar15 = FieldDescriptor::index(local_4d8,pcVar15,__c_02);
                  std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5e8,
                             (long)(int)pcVar15);
                  Formatter::Set<int>((Formatter *)in_stack_fffffffffffff610,
                                      (string *)
                                      CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                                      (int *)in_stack_fffffffffffff600);
                  std::__cxx11::string::~string(local_730);
                  std::allocator<char>::~allocator((allocator<char> *)&local_731);
                  Formatter::operator()
                            (in_stack_fffffffffffff6e0,
                             (char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                             (uint *)in_stack_fffffffffffff6d0,(int *)in_stack_fffffffffffff6c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff6c0);
                  goto LAB_004faba5;
                }
              }
              Formatter::operator()
                        (in_stack_fffffffffffff6e0,
                         (char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                         (uint *)in_stack_fffffffffffff6d0,(int *)in_stack_fffffffffffff6c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff6c0);
            }
            else {
              paVar16 = &local_701;
              std::allocator<char>::allocator();
              pcVar15 = "oneofoffset";
              std::__cxx11::string::string(local_700,"oneofoffset",paVar16);
              in_stack_fffffffffffff620 = FieldDescriptor::containing_oneof(local_4d8);
              pcVar15 = OneofDescriptor::index(in_stack_fffffffffffff620,pcVar15,__c_00);
              in_stack_fffffffffffff61c = (int)pcVar15;
              local_710 = (long)in_stack_fffffffffffff61c << 2;
              Formatter::Set<unsigned_long>
                        ((Formatter *)in_stack_fffffffffffff610,
                         (string *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                         (unsigned_long *)in_stack_fffffffffffff600);
              std::__cxx11::string::~string(local_700);
              std::allocator<char>::~allocator((allocator<char> *)&local_701);
              Formatter::operator()
                        (in_stack_fffffffffffff6e0,
                         (char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                         (uint *)in_stack_fffffffffffff6d0,(int *)in_stack_fffffffffffff6c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff6c0);
            }
          }
LAB_004faba5:
          local_54 = 0;
        }
        std::__cxx11::string::~string(local_548);
        std::__cxx11::string::~string(local_500);
        local_4c0 = local_4c0 + 1;
      }
      sVar8 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&local_70);
      iVar3 = (int)sVar8;
      sVar8 = std::
              vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ::size(local_498);
      local_738 = iVar3 + (int)sVar8 + 2;
      in_stack_fffffffffffff5e0 = (LogMessage *)Descriptor::file((Descriptor *)*in_RDI);
      bVar1 = UseUnknownFieldSet((FileDescriptor *)in_stack_fffffffffffff5d0,
                                 in_stack_fffffffffffff5c8);
      pcVar15 = "UnknownFieldSerializerLite";
      if (bVar1) {
        pcVar15 = "UnknownFieldSetSerializer";
      }
      paVar16 = &local_759;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_758,pcVar15,paVar16);
      std::allocator<char>::~allocator((allocator<char> *)&local_759);
      Formatter::operator()
                ((Formatter *)in_stack_fffffffffffff690,
                 (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                 in_stack_fffffffffffff680);
      local_4 = local_738;
      local_54 = 1;
      std::__cxx11::string::~string(local_758);
      std::
      vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::~vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 *)in_stack_fffffffffffff5e0);
    }
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)in_stack_fffffffffffff5e0);
  }
  Formatter::~Formatter((Formatter *)0x4fadae);
  return local_4;
}

Assistant:

int MessageGenerator::GenerateFieldMetadata(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (!options_.table_driven_serialization) {
    return 0;
  }

  std::vector<const FieldDescriptor*> sorted = SortFieldsByNumber(descriptor_);
  if (IsMapEntryMessage(descriptor_)) {
    for (int i = 0; i < 2; i++) {
      const FieldDescriptor* field = sorted[i];
      const FieldGenerator& generator = field_generators_.get(field);

      uint32 tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormat::WireTypeForFieldType(field->type()));

      std::map<std::string, std::string> vars;
      vars["classtype"] = QualifiedClassName(descriptor_, options_);
      vars["field_name"] = FieldName(field);
      vars["tag"] = StrCat(tag);
      vars["hasbit"] = StrCat(i);
      vars["type"] = StrCat(CalcFieldNum(generator, field, options_));
      vars["ptr"] = "nullptr";
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        GOOGLE_CHECK(!IsMapEntryMessage(field->message_type()));
        vars["ptr"] =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
      Formatter::SaveState saver(&format);
      format.AddMap(vars);
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, $field_name$_), $tag$,"
          "PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, _has_bits_) * 8 + $hasbit$, $type$, "
          "$ptr$},\n");
    }
    return 2;
  }
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_),"
      " 0, 0, 0, nullptr},\n");
  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  sorted_extensions.reserve(descriptor_->extension_range_count());
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeSorter());
  for (int i = 0, extension_idx = 0; /* no range */; i++) {
    for (; extension_idx < sorted_extensions.size() &&
           (i == sorted.size() ||
            sorted_extensions[extension_idx]->start < sorted[i]->number());
         extension_idx++) {
      const Descriptor::ExtensionRange* range =
          sorted_extensions[extension_idx];
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), "
          "$1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::ExtensionSerializer)},\n",
          range->start, range->end);
    }
    if (i == sorted.size()) break;
    const FieldDescriptor* field = sorted[i];

    uint32 tag = internal::WireFormatLite::MakeTag(
        field->number(), WireFormat::WireTypeForFieldType(field->type()));
    if (field->is_packed()) {
      tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    }

    std::string classfieldname = FieldName(field);
    if (field->containing_oneof()) {
      classfieldname = field->containing_oneof()->name();
    }
    format.Set("field_name", classfieldname);
    std::string ptr = "nullptr";
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (IsMapEntryMessage(field->message_type())) {
        format(
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, "
            "::$proto_ns$::internal::FieldMetadata::kSpecial, "
            "reinterpret_cast<const void*>(static_cast< "
            "::$proto_ns$::internal::SpecialSerializer>("
            "::$proto_ns$::internal::MapFieldSerializer< "
            "::$proto_ns$::internal::MapEntryToMapField<"
            "$3$>::MapFieldType, "
            "$tablename$::serialization_table>))},\n",
            tag, FindMessageIndexInFile(field->message_type()),
            QualifiedClassName(field->message_type(), options_));
        continue;
      } else if (!field->message_type()->options().message_set_wire_format()) {
        // message_set doesn't have the usual table and we need to
        // dispatch to generated serializer, hence ptr stays zero.
        ptr =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
    }

    const FieldGenerator& generator = field_generators_.get(field);
    int type = CalcFieldNum(generator, field, options_);

    if (IsLazy(field, options_)) {
      type = internal::FieldMetadata::kSpecial;
      ptr = "reinterpret_cast<const void*>(::" + variables_["proto_ns"] +
            "::internal::LazyFieldSerializer";
      if (field->containing_oneof()) {
        ptr += "OneOf";
      } else if (!HasFieldPresence(descriptor_->file()) ||
                 has_bit_indices_[field->index()] == -1) {
        ptr += "NoPresence";
      }
      ptr += ")";
    }

    if (field->options().weak()) {
      // TODO(gerbens) merge weak fields into ranges
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "$classtype$, _weak_field_map_), $1$, $1$, "
          "::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n",
          tag);
    } else if (field->containing_oneof()) {
      format.Set("oneofoffset",
                 sizeof(uint32) * field->containing_oneof()->index());
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$,"
          " PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + "
          "$oneofoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else if (HasFieldPresence(descriptor_->file()) &&
               has_bit_indices_[field->index()] != -1) {
      format.Set("hasbitsoffset", has_bit_indices_[field->index()]);
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + "
          "$hasbitsoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else {
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, ~0u, $2$, $3$},\n",
          tag, type, ptr);
    }
  }
  int num_field_metadata = 1 + sorted.size() + sorted_extensions.size();
  num_field_metadata++;
  std::string serializer = UseUnknownFieldSet(descriptor_->file(), options_)
                               ? "UnknownFieldSetSerializer"
                               : "UnknownFieldSerializerLite";
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, "
      "::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const "
      "void*>(::$proto_ns$::internal::$1$)},\n",
      serializer);
  return num_field_metadata;
}